

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient3dadapt(double *pa,double *pb,double *pc,double *pd,double permanent)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int elen;
  int iVar14;
  int iVar15;
  undefined4 uVar16;
  uint uVar17;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dStack_1270;
  double dStack_1260;
  double dStack_1250;
  double dStack_1230;
  double dStack_1210;
  double dStack_11b0;
  double u [4];
  double local_10f8;
  double dStack_10f0;
  double local_10e8;
  double local_10e0;
  undefined1 local_10d8 [16];
  double local_10c8;
  double local_10c0;
  double local_10b8;
  double dStack_10b0;
  double local_10a8;
  double local_10a0;
  undefined1 local_1098 [16];
  double local_1088;
  double dStack_1080;
  double local_1078;
  double dStack_1070;
  undefined1 local_1068 [16];
  double local_1058;
  double dStack_1050;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  double local_1028;
  double dStack_1020;
  double local_1018;
  undefined8 uStack_1010;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  double local_fe8;
  undefined8 uStack_fe0;
  double local_fd8;
  double dStack_fd0;
  double local_fc8;
  double dStack_fc0;
  double local_fb8;
  double dStack_fb0;
  double local_fa8;
  undefined8 uStack_fa0;
  double local_f98;
  double dStack_f90;
  undefined1 local_f88 [16];
  double local_f78;
  double dStack_f70;
  double local_f68;
  double local_f60;
  double local_f58;
  double dStack_f50;
  double local_f48;
  double local_f40;
  double local_f38;
  double dStack_f30;
  double local_f28;
  double dStack_f20;
  double w [16];
  double v [12];
  double abt [8];
  double cat [8];
  double bct [8];
  double adet [8];
  double cdet [8];
  double bdet [8];
  double abdet [16];
  double fin1 [192];
  double fin2 [192];
  double *pdVar18;
  
  dVar26 = splitter;
  local_10d8._8_8_ = local_10d8._0_8_;
  local_1038._8_8_ = local_1038._0_8_;
  dVar42 = *pa;
  local_fa8 = pb[1];
  dVar44 = *pb;
  dVar27 = *pc;
  local_fc8 = *pd;
  local_fd8 = pd[1];
  auVar1._8_4_ = SUB84(dVar27,0);
  auVar1._0_8_ = dVar44;
  auVar1._12_4_ = (int)((ulong)dVar27 >> 0x20);
  dVar38 = dVar44 - local_fc8;
  dVar27 = dVar27 - local_fc8;
  uStack_fa0 = 0;
  dVar22 = dVar42 - local_fc8;
  dVar28 = local_fa8 - local_fd8;
  dVar53 = pc[1];
  dVar23 = pa[1];
  auVar2._8_4_ = SUB84(dVar23,0);
  auVar2._0_8_ = dVar53;
  auVar2._12_4_ = (int)((ulong)dVar23 >> 0x20);
  dVar31 = dVar53 - local_fd8;
  auVar3._8_4_ = SUB84(dVar23 - local_fd8,0);
  auVar3._0_8_ = dVar31;
  auVar3._12_4_ = (int)((ulong)(dVar23 - local_fd8) >> 0x20);
  local_1018 = splitter;
  uStack_1010 = 0;
  auVar4._8_4_ = SUB84(splitter,0);
  auVar4._0_8_ = splitter;
  auVar4._12_4_ = (int)((ulong)splitter >> 0x20);
  dVar29 = dVar27 * splitter - (dVar27 * splitter - dVar27);
  dVar32 = dVar31 * splitter - (dVar31 * splitter - dVar31);
  dVar35 = dVar28 * splitter - (dVar28 * splitter - dVar28);
  dVar39 = dVar38 * splitter - (dVar38 * splitter - dVar38);
  dVar23 = dVar38 * dVar31;
  local_1008._8_4_ = SUB84(dVar27,0);
  local_1008._0_8_ = dVar31;
  local_1008._12_4_ = (int)((ulong)dVar27 >> 0x20);
  dVar43 = dVar22 * dVar31;
  dVar56 = dVar28 * dVar27;
  dVar49 = dVar27 - dVar29;
  dVar50 = dVar31 - dVar32;
  dVar46 = dVar28 - dVar35;
  dVar48 = dVar38 - dVar39;
  dVar36 = dVar46 * dVar49 - (((dVar56 - dVar29 * dVar35) - dVar49 * dVar35) - dVar46 * dVar29);
  dVar40 = dVar48 * dVar50 - (((dVar23 - dVar39 * dVar32) - dVar48 * dVar32) - dVar50 * dVar39);
  dVar41 = dVar40 - dVar36;
  dVar30 = dVar23 + dVar41;
  dVar24 = (dVar23 - (dVar30 - (dVar30 - dVar23))) + (dVar41 - (dVar30 - dVar23));
  auVar7._8_4_ = SUB84(dVar56,0);
  auVar7._0_8_ = dVar43;
  auVar7._12_4_ = (int)((ulong)dVar56 >> 0x20);
  dVar25 = dVar24 - dVar56;
  dVar23 = pa[2];
  dVar55 = pb[2];
  local_f38 = (dVar40 - (dVar41 + (dVar40 - dVar41))) + ((dVar40 - dVar41) - dVar36);
  dStack_f30 = (dVar24 - (dVar25 + (dVar24 - dVar25))) + ((dVar24 - dVar25) - dVar56);
  local_fe8 = pd[2];
  dVar56 = pc[2];
  dStack_f20 = dVar30 + dVar25;
  local_f28 = (dVar30 - (dStack_f20 - (dStack_f20 - dVar30))) + (dVar25 - (dStack_f20 - dVar30));
  dVar30 = dVar56 - local_fe8;
  uStack_fe0 = 0;
  local_ff8._8_4_ = SUB84(local_fe8,0);
  local_ff8._0_8_ = local_fe8;
  local_ff8._12_4_ = (int)((ulong)local_fe8 >> 0x20);
  dVar36 = dVar23 - local_fe8;
  dVar51 = dVar55 - local_fe8;
  dVar24 = -dVar29;
  auVar5._8_4_ = SUB84(dVar39,0);
  auVar5._0_8_ = dVar24;
  auVar5._12_4_ = (uint)((ulong)dVar39 >> 0x20) ^ 0x80000000;
  dStack_fd0 = local_fd8;
  dStack_fc0 = local_fc8;
  local_fb8 = local_fc8;
  dStack_fb0 = local_fd8;
  iVar11 = scale_expansion_zeroelim(4,&local_f38,dVar36,adet);
  dStack_1260 = auVar3._8_8_;
  local_1088 = dStack_1260;
  dStack_1080 = dStack_1260;
  dVar25 = dVar27 * dStack_1260;
  dStack_1270 = auVar4._8_8_;
  dVar41 = dVar26 * dStack_1260 - (dVar26 * dStack_1260 - dStack_1260);
  dVar33 = dStack_1270 * dVar22 - (dStack_1270 * dVar22 - dVar22);
  local_f98 = dStack_1260 - dVar41;
  dStack_f90 = dVar22 - dVar33;
  dVar33 = -dVar33;
  dVar52 = -dStack_f90;
  dVar40 = dVar49 * local_f98 - (local_f98 * dVar24 + dVar41 * -dVar49 + dVar25 + dVar41 * dVar24);
  dVar34 = dVar50 * dStack_f90 - (dVar33 * dVar50 + dVar52 * dVar32 + dVar43 + dVar33 * dVar32);
  dVar37 = dVar40 - dVar34;
  dVar26 = dVar25 + dVar37;
  dVar24 = (dVar25 - (dVar26 - (dVar26 - dVar25))) + (dVar37 - (dVar26 - dVar25));
  dVar25 = dVar24 - dVar43;
  local_f58 = (dVar40 - (dVar37 + (dVar40 - dVar37))) + ((dVar40 - dVar37) - dVar34);
  dStack_f50 = (dVar24 - ((dVar24 - dVar25) + dVar25)) + ((dVar24 - dVar25) - dVar43);
  local_f40 = dVar26 + dVar25;
  local_f48 = (dVar26 - (local_f40 - (local_f40 - dVar26))) + (dVar25 - (local_f40 - dVar26));
  local_f88._8_4_ = SUB84(local_f98,0);
  local_f88._0_8_ = dStack_f90;
  local_f88._12_4_ = (int)((ulong)local_f98 >> 0x20);
  local_1098._8_4_ = SUB84(dVar51,0);
  local_1098._0_8_ = dVar51;
  local_1098._12_4_ = (int)((ulong)dVar51 >> 0x20);
  iVar12 = scale_expansion_zeroelim(4,&local_f58,dVar51,bdet);
  dVar25 = dVar28 * dVar22;
  dVar40 = dStack_1260 * dVar38;
  dStack_1230 = auVar5._8_8_;
  dVar33 = (double)local_f88._0_8_ * dVar46 -
           (dVar46 * dVar33 + dVar52 * dVar35 + dVar33 * dVar35 + dVar25);
  dVar34 = (double)local_f88._8_8_ * dVar48 -
           (local_f98 * dStack_1230 + -dVar48 * dVar41 + dStack_1230 * dVar41 + dVar40);
  dVar41 = dVar33 - dVar34;
  dVar24 = dVar25 + dVar41;
  dVar25 = (dVar25 - (dVar24 - (dVar24 - dVar25))) + (dVar41 - (dVar24 - dVar25));
  dVar26 = dVar25 - dVar40;
  local_f78 = (dVar33 - (dVar41 + (dVar33 - dVar41))) + ((dVar33 - dVar41) - dVar34);
  dStack_f70 = (dVar25 - ((dVar25 - dVar26) + dVar26)) + ((dVar25 - dVar26) - dVar40);
  local_f60 = dVar24 + dVar26;
  local_f68 = (dVar24 - (local_f60 - (local_f60 - dVar24))) + (dVar26 - (local_f60 - dVar24));
  pdVar18 = cdet;
  iVar13 = scale_expansion_zeroelim(4,&local_f78,dVar30,pdVar18);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,adet,iVar12,bdet,abdet);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,abdet,iVar13,pdVar18,fin1);
  uVar16 = SUB84(pdVar18,0);
  dVar24 = estimate(iVar11,fin1);
  if (o3derrboundB * permanent <= dVar24) {
    return dVar24;
  }
  if (o3derrboundB * permanent <= -dVar24) {
    return dVar24;
  }
  dVar25 = (dVar42 - (dVar22 + (dVar42 - dVar22))) + ((dVar42 - dVar22) - local_fb8);
  dStack_1210 = auVar1._8_8_;
  dStack_1250 = auVar2._8_8_;
  dVar26 = (dVar44 - (dVar38 + (dVar44 - dVar38))) + ((dVar44 - dVar38) - local_fc8);
  dVar41 = (dStack_1210 - (dVar27 + (dStack_1210 - dVar27))) + ((dStack_1210 - dVar27) - dStack_fc0)
  ;
  dVar42 = (dVar53 - (dVar31 + (dVar53 - dVar31))) + ((dVar53 - dVar31) - local_fd8);
  dVar44 = (dStack_1250 - (dStack_1260 + (dStack_1250 - dStack_1260))) +
           ((dStack_1250 - dStack_1260) - dStack_fd0);
  dVar53 = (dVar23 - (dVar36 + (dVar23 - dVar36))) + ((dVar23 - dVar36) - (double)local_ff8._0_8_);
  dVar23 = (dVar55 - (dVar51 + (dVar55 - dVar51))) + ((dVar55 - dVar51) - (double)local_ff8._8_8_);
  dVar55 = (dVar56 - (dVar30 + (dVar56 - dVar30))) + ((dVar56 - dVar30) - local_fe8);
  dVar56 = (local_fa8 - (dVar28 + (local_fa8 - dVar28))) + ((local_fa8 - dVar28) - dStack_fb0);
  auVar6._8_8_ = -(ulong)(dVar56 == 0.0);
  auVar6._0_8_ = -(ulong)(dVar55 == 0.0);
  uVar17 = movmskpd(uVar16,auVar6);
  bVar10 = (byte)uVar17;
  if (((((dVar25 == 0.0) && (!NAN(dVar25))) && (dVar26 == 0.0)) &&
      ((!NAN(dVar26) && (dVar41 == 0.0)))) &&
     ((((!NAN(dVar41) && ((dVar44 == 0.0 && (!NAN(dVar44))))) && (bVar10 >> 1 != 0)) &&
      ((((dVar42 == 0.0 && (!NAN(dVar42))) && (dVar53 == 0.0)) &&
       (((!NAN(dVar53) && (dVar23 == 0.0)) && ((!NAN(dVar23) && ((uVar17 & 1) != 0)))))))))) {
    return dVar24;
  }
  dVar54 = permanent * o3derrboundC + ABS(dVar24) * resulterrbound;
  dVar37 = dVar26 * dVar31;
  dVar45 = dVar41 * dStack_1260;
  dVar33 = dVar56 * dVar27;
  dVar34 = dVar42 * dVar22;
  dStack_11b0 = auVar7._8_8_;
  dVar52 = dVar25 * dVar28;
  dVar47 = dVar38 * dVar44;
  dVar24 = ((dVar22 * dVar56 + dVar52) - (local_1088 * dVar26 + dVar47)) * dVar30 +
           (dVar22 * dVar28 - dVar40) * dVar55 +
           ((dVar27 * dVar44 + dVar45) - (dVar25 * dVar31 + dVar34)) * dVar51 +
           (dStack_1260 * (double)local_1008._8_8_ - dVar43) * dVar23 +
           ((dVar38 * dVar42 + dVar37) - (dVar41 * dVar28 + dVar33)) * dVar36 +
           (dVar38 * (double)local_1008._0_8_ - dStack_11b0) * dVar53 + dVar24;
  if (dVar54 <= dVar24) {
    return dVar24;
  }
  if (dVar54 <= -dVar24) {
    return dVar24;
  }
  iVar12 = 2;
  if ((dVar25 != 0.0) || (NAN(dVar25))) {
    dVar24 = dVar25 * local_1018 - (dVar25 * local_1018 - dVar25);
    dVar43 = dVar25 - dVar24;
    local_10b8 = dVar46 * dVar43 -
                 (((dVar52 - dVar24 * dVar35) - dVar35 * dVar43) - dVar24 * dVar46);
    if ((dVar44 != 0.0) || (NAN(dVar44))) {
      dVar51 = local_1018 * dVar44 - (local_1018 * dVar44 - dVar44);
      dVar40 = dVar44 - dVar51;
      dVar46 = dVar48 * dVar40 - (((dVar47 - dVar51 * dVar39) - dVar39 * dVar40) - dVar51 * dVar48);
      dVar54 = local_10b8 - dVar46;
      dVar48 = dVar52 + dVar54;
      dVar35 = (dVar52 - (dVar48 - (dVar48 - dVar52))) + (dVar54 - (dVar48 - dVar52));
      dVar39 = dVar35 - dVar47;
      local_10b8 = (local_10b8 - (dVar54 + (local_10b8 - dVar54))) +
                   ((local_10b8 - dVar54) - dVar46);
      dStack_10b0 = (dVar35 - ((dVar35 - dVar39) + dVar39)) + ((dVar35 - dVar39) - dVar47);
      local_10a0 = dVar48 + dVar39;
      local_10a8 = (dVar48 - (local_10a0 - (local_10a0 - dVar48))) +
                   (dVar39 - (local_10a0 - dVar48));
      dVar35 = dVar44 * dVar27;
      dVar39 = dVar31 * dVar25;
      dVar40 = dVar40 * dVar49 - (-dVar51 * dVar49 + -dVar40 * dVar29 + -dVar51 * dVar29 + dVar35);
      dVar24 = dVar43 * dVar50 - (-dVar24 * dVar50 + -dVar43 * dVar32 + -dVar24 * dVar32 + dVar39);
      dVar46 = dVar40 - dVar24;
      dVar29 = dVar35 + dVar46;
      dVar43 = (dVar35 - (dVar29 - (dVar29 - dVar35))) + (dVar46 - (dVar29 - dVar35));
      dVar32 = dVar43 - dVar39;
      dVar43 = (dVar43 - (dVar32 + (dVar43 - dVar32))) + ((dVar43 - dVar32) - dVar39);
      local_1038._8_4_ = SUB84(dVar43,0);
      local_1038._0_8_ = (dVar40 - (dVar46 + (dVar40 - dVar46))) + ((dVar40 - dVar46) - dVar24);
      local_1038._12_4_ = (int)((ulong)dVar43 >> 0x20);
      dStack_1020 = dVar29 + dVar32;
      local_1028 = (dVar29 - (dStack_1020 - (dStack_1020 - dVar29))) +
                   (dVar32 - (dStack_1020 - dVar29));
      iVar12 = 4;
    }
    else {
      dVar24 = -dVar25;
      dVar43 = local_1018 * dVar24 - (dVar25 + local_1018 * dVar24);
      local_1038._8_8_ = dVar31 * dVar24;
      local_1038._0_8_ =
           dVar50 * (dVar24 - dVar43) -
           (((dVar31 * dVar24 - dVar43 * dVar32) - dVar32 * (dVar24 - dVar43)) - dVar43 * dVar50);
      dStack_10b0 = dVar52;
    }
  }
  else if ((dVar44 != 0.0) || (NAN(dVar44))) {
    dVar24 = -dVar44;
    dVar43 = local_1018 * dVar24 - (dVar44 + local_1018 * dVar24);
    local_10b8 = (dVar24 - dVar43) * dVar48 -
                 (((dVar38 * dVar24 - dVar43 * dVar39) - dVar39 * (dVar24 - dVar43)) -
                 dVar43 * dVar48);
    dVar43 = local_1018 * dVar44 - (local_1018 * dVar44 - dVar44);
    local_1038._8_8_ = dVar27 * dVar44;
    local_1038._0_8_ =
         (dVar44 - dVar43) * dVar49 -
         (((dVar27 * dVar44 - dVar43 * dVar29) - dVar29 * (dVar44 - dVar43)) - dVar43 * dVar49);
    dStack_10b0 = dVar38 * dVar24;
  }
  else {
    local_10b8 = 0.0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_1038._8_8_;
    local_1038 = auVar8 << 0x40;
    iVar12 = 1;
  }
  if ((dVar26 != 0.0) || (NAN(dVar26))) {
    dVar40 = dVar26 * splitter - (dVar26 * splitter - dVar26);
    dVar24 = dVar26 - dVar40;
    dVar43 = dVar31 * splitter - (dVar31 * splitter - dVar31);
    local_10d8._0_8_ =
         (dVar31 - dVar43) * dVar24 -
         (((dVar37 - dVar40 * dVar43) - dVar43 * dVar24) - dVar40 * (dVar31 - dVar43));
    if (bVar10 >> 1 != 0) {
      local_10d8._8_8_ = dVar37;
      dVar31 = -dVar26;
      dStack_1050 = local_1088 * dVar31;
      dVar27 = splitter * dVar31 - (dVar26 + splitter * dVar31);
      dVar24 = local_1088 * splitter - (local_1088 * splitter - local_1088);
      dVar43 = ((dStack_1050 - dVar27 * dVar24) - dVar24 * (dVar31 - dVar27)) -
               dVar27 * (local_1088 - dVar24);
      local_1058 = (local_1088 - dVar24) * (dVar31 - dVar27);
      goto LAB_0014fb4b;
    }
    dVar35 = dVar56 * splitter - (dVar56 * splitter - dVar56);
    dVar32 = dVar56 - dVar35;
    dVar31 = dVar27 * splitter - (dVar27 * splitter - dVar27);
    dVar39 = (dVar27 - dVar31) * dVar32 -
             (((dVar33 - dVar35 * dVar31) - dVar31 * dVar32) - dVar35 * (dVar27 - dVar31));
    dVar29 = (double)local_10d8._0_8_ - dVar39;
    dVar31 = dVar37 + dVar29;
    dVar27 = (dVar37 - (dVar31 - (dVar31 - dVar37))) + (dVar29 - (dVar31 - dVar37));
    dVar43 = dVar27 - dVar33;
    dVar27 = (dVar27 - ((dVar27 - dVar43) + dVar43)) + ((dVar27 - dVar43) - dVar33);
    local_10d8._8_4_ = SUB84(dVar27,0);
    local_10d8._0_8_ =
         ((double)local_10d8._0_8_ - (dVar29 + ((double)local_10d8._0_8_ - dVar29))) +
         (((double)local_10d8._0_8_ - dVar29) - dVar39);
    local_10d8._12_4_ = (int)((ulong)dVar27 >> 0x20);
    local_10c0 = dVar31 + dVar43;
    local_10c8 = (dVar31 - (local_10c0 - (local_10c0 - dVar31))) + (dVar43 - (local_10c0 - dVar31));
    dVar27 = splitter * dVar22 - (splitter * dVar22 - dVar22);
    dVar31 = splitter * dStack_1260 - (splitter * dStack_1260 - dStack_1260);
    dVar43 = dVar56 * dVar22;
    dVar29 = dVar26 * dStack_1260;
    dVar32 = dVar32 * (dVar22 - dVar27) -
             (-dVar35 * (dVar22 - dVar27) + -dVar32 * dVar27 + -dVar35 * dVar27 + dVar43);
    dVar40 = dVar24 * (dStack_1260 - dVar31) -
             (-dVar40 * (dStack_1260 - dVar31) + -dVar24 * dVar31 + -dVar40 * dVar31 + dVar29);
    dVar33 = dVar32 - dVar40;
    dVar27 = dVar43 + dVar33;
    dVar31 = (dVar43 - (dVar27 - (dVar27 - dVar43))) + (dVar33 - (dVar27 - dVar43));
    dVar24 = dVar31 - dVar29;
    local_1058 = (dVar32 - (dVar33 + (dVar32 - dVar33))) + ((dVar32 - dVar33) - dVar40);
    dStack_1050 = (dVar31 - (dVar24 + (dVar31 - dVar24))) + ((dVar31 - dVar24) - dVar29);
    dVar31 = dVar27 + dVar24;
    local_1048._8_4_ = SUB84(dVar31,0);
    local_1048._0_8_ = (dVar27 - (dVar31 - (dVar31 - dVar27))) + (dVar24 - (dVar31 - dVar27));
    local_1048._12_4_ = (int)((ulong)dVar31 >> 0x20);
    iVar13 = 4;
  }
  else if (bVar10 >> 1 == 0) {
    dVar31 = -dVar56;
    dVar24 = splitter * dVar31 - (dVar56 + splitter * dVar31);
    dVar43 = dVar27 * splitter - (dVar27 * splitter - dVar27);
    local_10d8._8_8_ = dVar27 * dVar31;
    local_10d8._0_8_ =
         (dVar27 - dVar43) * (dVar31 - dVar24) -
         (((dVar27 * dVar31 - dVar24 * dVar43) - dVar43 * (dVar31 - dVar24)) -
         dVar24 * (dVar27 - dVar43));
    dStack_1050 = dVar22 * dVar56;
    dVar31 = dVar56 * splitter - (dVar56 * splitter - dVar56);
    dVar27 = splitter * dVar22 - (splitter * dVar22 - dVar22);
    dVar43 = ((dStack_1050 - dVar31 * dVar27) - dVar27 * (dVar56 - dVar31)) -
             dVar31 * (dVar22 - dVar27);
    local_1058 = (dVar22 - dVar27) * (dVar56 - dVar31);
LAB_0014fb4b:
    local_1058 = local_1058 - dVar43;
    iVar13 = 2;
  }
  else {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_10d8._8_8_;
    local_10d8 = auVar9 << 0x40;
    local_1058 = 0.0;
    iVar13 = 1;
  }
  if ((dVar41 != 0.0) || (NAN(dVar41))) {
    dVar31 = dVar41 * splitter - (dVar41 * splitter - dVar41);
    dVar27 = dVar41 - dVar31;
    dVar24 = local_1088 * splitter - (local_1088 * splitter - local_1088);
    local_10f8 = (local_1088 - dVar24) * dVar27 -
                 (((dVar45 - dVar31 * dVar24) - dVar24 * dVar27) - dVar31 * (local_1088 - dVar24));
    if ((dVar42 == 0.0) && (!NAN(dVar42))) {
      dVar38 = -dVar41;
      dStack_1070 = dVar28 * dVar38;
      dVar27 = splitter * dVar38 - (dVar41 + splitter * dVar38);
      dVar31 = dVar28 * splitter - (dVar28 * splitter - dVar28);
      local_1078 = (dVar28 - dVar31) * (dVar38 - dVar27) -
                   (((dStack_1070 - dVar27 * dVar31) - dVar31 * (dVar38 - dVar27)) -
                   dVar27 * (dVar28 - dVar31));
      dStack_10f0 = dVar45;
      goto LAB_0015008a;
    }
    dVar40 = dVar42 * splitter - (dVar42 * splitter - dVar42);
    dVar32 = dVar42 - dVar40;
    dVar24 = dVar22 * splitter - (dVar22 * splitter - dVar22);
    dVar43 = (dVar22 - dVar24) * dVar32 -
             (((dVar34 - dVar40 * dVar24) - dVar24 * dVar32) - dVar40 * (dVar22 - dVar24));
    dVar22 = local_10f8 - dVar43;
    dVar24 = dVar45 + dVar22;
    dVar29 = (dVar45 - (dVar24 - (dVar24 - dVar45))) + (dVar22 - (dVar24 - dVar45));
    dVar33 = dVar29 - dVar34;
    local_10f8 = (local_10f8 - (dVar22 + (local_10f8 - dVar22))) + ((local_10f8 - dVar22) - dVar43);
    dStack_10f0 = (dVar29 - ((dVar29 - dVar33) + dVar33)) + ((dVar29 - dVar33) - dVar34);
    local_10e0 = dVar24 + dVar33;
    local_10e8 = (dVar24 - (local_10e0 - (local_10e0 - dVar24))) + (dVar33 - (local_10e0 - dVar24));
    dVar24 = splitter * dVar38 - (splitter * dVar38 - dVar38);
    dVar43 = splitter * dVar28 - (splitter * dVar28 - dVar28);
    dVar22 = dVar42 * dVar38;
    dVar29 = dVar41 * dVar28;
    dVar40 = dVar32 * (dVar38 - dVar24) -
             (-dVar40 * (dVar38 - dVar24) + -dVar32 * dVar24 + -dVar40 * dVar24 + dVar22);
    dVar43 = dVar27 * (dVar28 - dVar43) -
             (-dVar31 * (dVar28 - dVar43) + -dVar27 * dVar43 + -dVar31 * dVar43 + dVar29);
    dVar24 = dVar40 - dVar43;
    dVar27 = dVar22 + dVar24;
    dVar38 = (dVar22 - (dVar27 - (dVar27 - dVar22))) + (dVar24 - (dVar27 - dVar22));
    dVar31 = dVar38 - dVar29;
    local_1078 = (dVar40 - (dVar24 + (dVar40 - dVar24))) + ((dVar40 - dVar24) - dVar43);
    dStack_1070 = (dVar38 - (dVar31 + (dVar38 - dVar31))) + ((dVar38 - dVar31) - dVar29);
    dVar38 = dVar27 + dVar31;
    local_1068._8_4_ = SUB84(dVar38,0);
    local_1068._0_8_ = (dVar27 - (dVar38 - (dVar38 - dVar27))) + (dVar31 - (dVar38 - dVar27));
    local_1068._12_4_ = (int)((ulong)dVar38 >> 0x20);
    iVar15 = 4;
  }
  else if ((dVar42 != 0.0) || (NAN(dVar42))) {
    dVar31 = -dVar42;
    dVar27 = splitter * dVar31 - (dVar42 + splitter * dVar31);
    dVar24 = dVar22 * splitter - (dVar22 * splitter - dVar22);
    local_10f8 = (dVar22 - dVar24) * (dVar31 - dVar27) -
                 (((dVar22 * dVar31 - dVar27 * dVar24) - dVar24 * (dVar31 - dVar27)) -
                 dVar27 * (dVar22 - dVar24));
    dStack_1070 = dVar38 * dVar42;
    dVar24 = dVar42 * splitter - (dVar42 * splitter - dVar42);
    dVar27 = splitter * dVar38 - (splitter * dVar38 - dVar38);
    local_1078 = (dVar38 - dVar27) * (dVar42 - dVar24) -
                 (((dStack_1070 - dVar24 * dVar27) - dVar27 * (dVar42 - dVar24)) -
                 dVar24 * (dVar38 - dVar27));
    dStack_10f0 = dVar22 * dVar31;
LAB_0015008a:
    iVar15 = 2;
  }
  else {
    local_10f8 = 0.0;
    iVar15 = 1;
    local_1078 = 0.0;
  }
  elen = fast_expansion_sum_zeroelim(iVar13,(double *)local_10d8,iVar15,&local_1078,bct);
  iVar14 = scale_expansion_zeroelim(elen,bct,dVar36,w);
  pdVar18 = fin2;
  iVar11 = fast_expansion_sum_zeroelim(iVar11,fin1,iVar14,w,pdVar18);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,&local_10f8,iVar12,(double *)local_1038,cat);
  iVar14 = scale_expansion_zeroelim(iVar15,cat,(double)local_1098._0_8_,w);
  pdVar19 = fin1;
  iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar18,iVar14,w,pdVar19);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,&local_10b8,iVar13,&local_1058,abt);
  iVar13 = scale_expansion_zeroelim(iVar12,abt,dVar30,w);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar19,iVar13,w,pdVar18);
  if ((dVar53 != 0.0) || (NAN(dVar53))) {
    iVar13 = scale_expansion_zeroelim(4,&local_f38,dVar53,v);
    pdVar19 = fin2;
    pdVar18 = fin1;
    iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar19,iVar13,v,pdVar18);
  }
  if ((dVar23 != 0.0) || (pdVar20 = pdVar19, NAN(dVar23))) {
    iVar13 = scale_expansion_zeroelim(4,&local_f58,dVar23,v);
    iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar18,iVar13,v,pdVar19);
    pdVar20 = pdVar18;
    pdVar18 = pdVar19;
  }
  if ((dVar55 != 0.0) || (pdVar19 = pdVar18, NAN(dVar55))) {
    iVar13 = scale_expansion_zeroelim(4,&local_f78,dVar55,v);
    iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar18,iVar13,v,pdVar20);
    pdVar19 = pdVar20;
    pdVar20 = pdVar18;
  }
  if ((dVar25 != 0.0) || (NAN(dVar25))) {
    if ((dVar56 != 0.0) || (pdVar18 = pdVar19, pdVar21 = pdVar20, NAN(dVar56))) {
      dVar28 = dVar25 * dVar56;
      dVar27 = dVar25 * splitter - (dVar25 * splitter - dVar25);
      dVar38 = dVar56 * splitter - (dVar56 * splitter - dVar56);
      dVar22 = (dVar56 - dVar38) * (dVar25 - dVar27) -
               (((dVar28 - dVar27 * dVar38) - dVar38 * (dVar25 - dVar27)) -
               dVar27 * (dVar56 - dVar38));
      dVar31 = dVar30 * splitter - (dVar30 * splitter - dVar30);
      dVar24 = dVar30 - dVar31;
      dVar38 = dVar30 * dVar22;
      dVar27 = splitter * dVar22 - (splitter * dVar22 - dVar22);
      u[0] = (dVar22 - dVar27) * dVar24 -
             (((dVar38 - dVar27 * dVar31) - (dVar22 - dVar27) * dVar31) - dVar27 * dVar24);
      dVar43 = dVar28 * dVar30;
      dVar27 = splitter * dVar28 - (splitter * dVar28 - dVar28);
      dVar31 = (dVar28 - dVar27) * dVar24 -
               (((dVar43 - dVar27 * dVar31) - dVar31 * (dVar28 - dVar27)) - dVar27 * dVar24);
      dVar27 = dVar31 + dVar38;
      u[1] = (dVar38 - (dVar27 - (dVar27 - dVar38))) + (dVar31 - (dVar27 - dVar38));
      u[3] = dVar43 + dVar27;
      u[2] = dVar27 - (u[3] - dVar43);
      iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar19,4,u,pdVar20);
      if ((dVar55 != 0.0) || (pdVar18 = pdVar20, pdVar21 = pdVar19, NAN(dVar55))) {
        dVar31 = dVar55 * splitter - (dVar55 * splitter - dVar55);
        dVar24 = dVar55 - dVar31;
        dVar27 = dVar55 * dVar22;
        dVar38 = dVar22 * splitter - (dVar22 * splitter - dVar22);
        u[0] = (dVar22 - dVar38) * dVar24 -
               (((dVar27 - dVar38 * dVar31) - (dVar22 - dVar38) * dVar31) - dVar38 * dVar24);
        dVar43 = dVar28 * dVar55;
        dVar38 = splitter * dVar28 - (splitter * dVar28 - dVar28);
        dVar38 = (dVar28 - dVar38) * dVar24 -
                 (((dVar43 - dVar38 * dVar31) - dVar31 * (dVar28 - dVar38)) - dVar38 * dVar24);
        dVar31 = dVar27 + dVar38;
        u[1] = (dVar27 - (dVar31 - (dVar31 - dVar27))) + (dVar38 - (dVar31 - dVar27));
        u[3] = dVar43 + dVar31;
        u[2] = dVar31 - (u[3] - dVar43);
        iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar20,4,u,pdVar19);
        pdVar18 = pdVar19;
        pdVar21 = pdVar20;
      }
    }
    if ((dVar42 != 0.0) || (pdVar19 = pdVar18, pdVar20 = pdVar21, NAN(dVar42))) {
      dVar27 = -dVar25;
      dVar43 = dVar42 * dVar27;
      dVar38 = splitter * dVar27 - (dVar25 + splitter * dVar27);
      dVar31 = dVar42 * splitter - (dVar42 * splitter - dVar42);
      dVar22 = (dVar42 - dVar31) * (dVar27 - dVar38) -
               (((dVar43 - dVar38 * dVar31) - dVar31 * (dVar27 - dVar38)) -
               dVar38 * (dVar42 - dVar31));
      dVar31 = (double)local_1098._0_8_ * splitter -
               ((double)local_1098._0_8_ * splitter - (double)local_1098._0_8_);
      dVar24 = (double)local_1098._0_8_ - dVar31;
      dVar38 = (double)local_1098._0_8_ * dVar22;
      dVar27 = splitter * dVar22 - (splitter * dVar22 - dVar22);
      u[0] = (dVar22 - dVar27) * dVar24 -
             (((dVar38 - dVar27 * dVar31) - (dVar22 - dVar27) * dVar31) - dVar27 * dVar24);
      dVar25 = (double)local_1098._0_8_ * dVar43;
      dVar27 = splitter * dVar43 - (splitter * dVar43 - dVar43);
      dVar31 = (dVar43 - dVar27) * dVar24 -
               (((dVar25 - dVar27 * dVar31) - dVar31 * (dVar43 - dVar27)) - dVar27 * dVar24);
      dVar27 = dVar31 + dVar38;
      u[1] = (dVar38 - (dVar27 - (dVar27 - dVar38))) + (dVar31 - (dVar27 - dVar38));
      u[3] = dVar25 + dVar27;
      u[2] = dVar27 - (u[3] - dVar25);
      iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar18,4,u,pdVar21);
      if ((dVar23 != 0.0) || (pdVar19 = pdVar21, pdVar20 = pdVar18, NAN(dVar23))) {
        dVar31 = dVar23 * splitter - (dVar23 * splitter - dVar23);
        dVar24 = dVar23 - dVar31;
        dVar27 = dVar23 * dVar22;
        dVar38 = dVar22 * splitter - (dVar22 * splitter - dVar22);
        u[0] = (dVar22 - dVar38) * dVar24 -
               (((dVar27 - dVar38 * dVar31) - (dVar22 - dVar38) * dVar31) - dVar38 * dVar24);
        dVar25 = dVar43 * dVar23;
        dVar38 = splitter * dVar43 - (splitter * dVar43 - dVar43);
        dVar38 = (dVar43 - dVar38) * dVar24 -
                 (((dVar25 - dVar38 * dVar31) - dVar31 * (dVar43 - dVar38)) - dVar38 * dVar24);
        dVar31 = dVar27 + dVar38;
        u[1] = (dVar27 - (dVar31 - (dVar31 - dVar27))) + (dVar38 - (dVar31 - dVar27));
        u[3] = dVar25 + dVar31;
        u[2] = dVar31 - (u[3] - dVar25);
        iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar21,4,u,pdVar18);
        pdVar19 = pdVar18;
        pdVar20 = pdVar21;
      }
    }
  }
  if ((dVar26 != 0.0) || (NAN(dVar26))) {
    if ((dVar42 != 0.0) || (pdVar18 = pdVar19, pdVar21 = pdVar20, NAN(dVar42))) {
      dVar43 = dVar26 * dVar42;
      dVar27 = dVar26 * splitter - (dVar26 * splitter - dVar26);
      dVar38 = dVar42 * splitter - (dVar42 * splitter - dVar42);
      dVar25 = (dVar42 - dVar38) * (dVar26 - dVar27) -
               (((dVar43 - dVar27 * dVar38) - dVar38 * (dVar26 - dVar27)) -
               dVar27 * (dVar42 - dVar38));
      dVar38 = dVar36 * splitter - (dVar36 * splitter - dVar36);
      dVar31 = dVar36 - dVar38;
      dVar27 = dVar36 * dVar25;
      dVar42 = splitter * dVar25 - (splitter * dVar25 - dVar25);
      u[0] = (dVar25 - dVar42) * dVar31 -
             (((dVar27 - dVar42 * dVar38) - (dVar25 - dVar42) * dVar38) - dVar42 * dVar31);
      dVar24 = dVar36 * dVar43;
      dVar42 = splitter * dVar43 - (splitter * dVar43 - dVar43);
      dVar38 = (dVar43 - dVar42) * dVar31 -
               (((dVar24 - dVar42 * dVar38) - dVar38 * (dVar43 - dVar42)) - dVar42 * dVar31);
      dVar42 = dVar38 + dVar27;
      u[1] = (dVar27 - (dVar42 - (dVar42 - dVar27))) + (dVar38 - (dVar42 - dVar27));
      u[3] = dVar24 + dVar42;
      u[2] = dVar42 - (u[3] - dVar24);
      iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar19,4,u,pdVar20);
      if ((dVar53 != 0.0) || (pdVar18 = pdVar20, pdVar21 = pdVar19, NAN(dVar53))) {
        dVar27 = dVar53 * splitter - (dVar53 * splitter - dVar53);
        dVar38 = dVar53 - dVar27;
        dVar24 = dVar53 * dVar25;
        dVar42 = dVar25 * splitter - (dVar25 * splitter - dVar25);
        u[0] = (dVar25 - dVar42) * dVar38 -
               (((dVar24 - dVar42 * dVar27) - (dVar25 - dVar42) * dVar27) - dVar42 * dVar38);
        dVar31 = dVar53 * dVar43;
        dVar42 = splitter * dVar43 - (splitter * dVar43 - dVar43);
        dVar42 = (dVar43 - dVar42) * dVar38 -
                 (((dVar31 - dVar42 * dVar27) - dVar27 * (dVar43 - dVar42)) - dVar42 * dVar38);
        dVar27 = dVar24 + dVar42;
        u[1] = (dVar24 - (dVar27 - (dVar27 - dVar24))) + (dVar42 - (dVar27 - dVar24));
        u[3] = dVar31 + dVar27;
        u[2] = dVar27 - (u[3] - dVar31);
        iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar20,4,u,pdVar19);
        pdVar18 = pdVar19;
        pdVar21 = pdVar20;
      }
    }
    if ((dVar44 != 0.0) || (pdVar19 = pdVar18, pdVar20 = pdVar21, NAN(dVar44))) {
      dVar42 = -dVar26;
      dVar24 = dVar44 * dVar42;
      dVar27 = splitter * dVar42 - (dVar26 + splitter * dVar42);
      dVar38 = dVar44 * splitter - (dVar44 * splitter - dVar44);
      dVar25 = (dVar44 - dVar38) * (dVar42 - dVar27) -
               (((dVar24 - dVar27 * dVar38) - dVar38 * (dVar42 - dVar27)) -
               dVar27 * (dVar44 - dVar38));
      dVar38 = dVar30 * splitter - (dVar30 * splitter - dVar30);
      dVar31 = dVar30 - dVar38;
      dVar27 = dVar30 * dVar25;
      dVar42 = splitter * dVar25 - (splitter * dVar25 - dVar25);
      u[0] = (dVar25 - dVar42) * dVar31 -
             (((dVar27 - dVar42 * dVar38) - (dVar25 - dVar42) * dVar38) - dVar42 * dVar31);
      dVar30 = dVar30 * dVar24;
      dVar42 = splitter * dVar24 - (splitter * dVar24 - dVar24);
      dVar38 = (dVar24 - dVar42) * dVar31 -
               (((dVar30 - dVar42 * dVar38) - dVar38 * (dVar24 - dVar42)) - dVar42 * dVar31);
      dVar42 = dVar38 + dVar27;
      u[1] = (dVar27 - (dVar42 - (dVar42 - dVar27))) + (dVar38 - (dVar42 - dVar27));
      u[3] = dVar30 + dVar42;
      u[2] = dVar42 - (u[3] - dVar30);
      iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar18,4,u,pdVar21);
      if ((dVar55 != 0.0) || (pdVar19 = pdVar21, pdVar20 = pdVar18, NAN(dVar55))) {
        dVar38 = dVar55 * splitter - (dVar55 * splitter - dVar55);
        dVar31 = dVar55 - dVar38;
        dVar42 = dVar55 * dVar25;
        dVar27 = dVar25 * splitter - (dVar25 * splitter - dVar25);
        u[0] = (dVar25 - dVar27) * dVar31 -
               (((dVar42 - dVar27 * dVar38) - (dVar25 - dVar27) * dVar38) - dVar27 * dVar31);
        dVar25 = dVar24 * dVar55;
        dVar27 = splitter * dVar24 - (splitter * dVar24 - dVar24);
        dVar27 = (dVar24 - dVar27) * dVar31 -
                 (((dVar25 - dVar27 * dVar38) - dVar38 * (dVar24 - dVar27)) - dVar27 * dVar31);
        dVar38 = dVar42 + dVar27;
        u[1] = (dVar42 - (dVar38 - (dVar38 - dVar42))) + (dVar27 - (dVar38 - dVar42));
        u[3] = dVar25 + dVar38;
        u[2] = dVar38 - (u[3] - dVar25);
        iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar21,4,u,pdVar18);
        pdVar19 = pdVar18;
        pdVar20 = pdVar21;
      }
    }
  }
  if ((dVar41 != 0.0) || (NAN(dVar41))) {
    if ((dVar44 != 0.0) || (pdVar21 = pdVar19, pdVar18 = pdVar20, NAN(dVar44))) {
      dVar24 = dVar41 * dVar44;
      dVar42 = dVar41 * splitter - (dVar41 * splitter - dVar41);
      dVar27 = dVar44 * splitter - (dVar44 * splitter - dVar44);
      dVar25 = (dVar44 - dVar27) * (dVar41 - dVar42) -
               (((dVar24 - dVar42 * dVar27) - dVar27 * (dVar41 - dVar42)) -
               dVar42 * (dVar44 - dVar27));
      dVar38 = (double)local_1098._0_8_ * splitter -
               ((double)local_1098._0_8_ * splitter - (double)local_1098._0_8_);
      dVar31 = (double)local_1098._0_8_ - dVar38;
      dVar27 = (double)local_1098._0_8_ * dVar25;
      dVar42 = splitter * dVar25 - (splitter * dVar25 - dVar25);
      u[0] = (dVar25 - dVar42) * dVar31 -
             (((dVar27 - dVar42 * dVar38) - (dVar25 - dVar42) * dVar38) - dVar42 * dVar31);
      dVar44 = (double)local_1098._0_8_ * dVar24;
      dVar42 = splitter * dVar24 - (splitter * dVar24 - dVar24);
      dVar38 = (dVar24 - dVar42) * dVar31 -
               (((dVar44 - dVar42 * dVar38) - dVar38 * (dVar24 - dVar42)) - dVar42 * dVar31);
      dVar42 = dVar38 + dVar27;
      u[1] = (dVar27 - (dVar42 - (dVar42 - dVar27))) + (dVar38 - (dVar42 - dVar27));
      u[3] = dVar44 + dVar42;
      u[2] = dVar42 - (u[3] - dVar44);
      iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar19,4,u,pdVar20);
      if ((dVar23 != 0.0) || (pdVar21 = pdVar20, pdVar18 = pdVar19, NAN(dVar23))) {
        dVar27 = dVar23 * splitter - (dVar23 * splitter - dVar23);
        dVar38 = dVar23 - dVar27;
        dVar42 = dVar23 * dVar25;
        dVar44 = dVar25 * splitter - (dVar25 * splitter - dVar25);
        u[0] = (dVar25 - dVar44) * dVar38 -
               (((dVar42 - dVar44 * dVar27) - (dVar25 - dVar44) * dVar27) - dVar44 * dVar38);
        dVar31 = dVar24 * dVar23;
        dVar44 = splitter * dVar24 - (splitter * dVar24 - dVar24);
        dVar44 = (dVar24 - dVar44) * dVar38 -
                 (((dVar31 - dVar44 * dVar27) - dVar27 * (dVar24 - dVar44)) - dVar44 * dVar38);
        dVar27 = dVar42 + dVar44;
        u[1] = (dVar42 - (dVar27 - (dVar27 - dVar42))) + (dVar44 - (dVar27 - dVar42));
        u[3] = dVar31 + dVar27;
        u[2] = dVar27 - (u[3] - dVar31);
        iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar20,4,u,pdVar19);
        pdVar21 = pdVar19;
        pdVar18 = pdVar20;
      }
    }
    pdVar19 = pdVar21;
    pdVar20 = pdVar18;
    if ((dVar56 == 0.0) && (!NAN(dVar56))) goto LAB_00151938;
    dVar42 = -dVar41;
    dVar31 = dVar56 * dVar42;
    dVar44 = splitter * dVar42 - (dVar41 + splitter * dVar42);
    dVar27 = dVar56 * splitter - (dVar56 * splitter - dVar56);
    dVar38 = (dVar56 - dVar27) * (dVar42 - dVar44) -
             (((dVar31 - dVar44 * dVar27) - dVar27 * (dVar42 - dVar44)) - dVar44 * (dVar56 - dVar27)
             );
    dVar27 = dVar36 * splitter - (dVar36 * splitter - dVar36);
    dVar56 = dVar36 - dVar27;
    dVar44 = dVar36 * dVar38;
    dVar42 = splitter * dVar38 - (splitter * dVar38 - dVar38);
    u[0] = (dVar38 - dVar42) * dVar56 -
           (((dVar44 - dVar42 * dVar27) - (dVar38 - dVar42) * dVar27) - dVar42 * dVar56);
    dVar36 = dVar36 * dVar31;
    dVar42 = splitter * dVar31 - (splitter * dVar31 - dVar31);
    dVar27 = (dVar31 - dVar42) * dVar56 -
             (((dVar36 - dVar42 * dVar27) - dVar27 * (dVar31 - dVar42)) - dVar42 * dVar56);
    dVar42 = dVar27 + dVar44;
    u[1] = (dVar44 - (dVar42 - (dVar42 - dVar44))) + (dVar27 - (dVar42 - dVar44));
    u[3] = dVar36 + dVar42;
    u[2] = dVar42 - (u[3] - dVar36);
    iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar21,4,u,pdVar18);
    if ((dVar53 == 0.0) && (!NAN(dVar53))) goto LAB_00151978;
    dVar27 = dVar53 * splitter - (dVar53 * splitter - dVar53);
    dVar56 = dVar53 - dVar27;
    dVar42 = dVar53 * dVar38;
    dVar44 = dVar38 * splitter - (dVar38 * splitter - dVar38);
    u[0] = (dVar38 - dVar44) * dVar56 -
           (((dVar42 - dVar44 * dVar27) - (dVar38 - dVar44) * dVar27) - dVar44 * dVar56);
    dVar38 = dVar31 * dVar53;
    dVar44 = splitter * dVar31 - (splitter * dVar31 - dVar31);
    dVar44 = (dVar31 - dVar44) * dVar56 -
             (((dVar38 - dVar44 * dVar27) - dVar27 * (dVar31 - dVar44)) - dVar44 * dVar56);
    dVar27 = dVar42 + dVar44;
    u[1] = (dVar42 - (dVar27 - (dVar27 - dVar42))) + (dVar44 - (dVar27 - dVar42));
    u[3] = dVar38 + dVar27;
    u[2] = dVar27 - (u[3] - dVar38);
    iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar18,4,u,pdVar21);
  }
  else {
LAB_00151938:
    if ((dVar53 == 0.0) && (pdVar18 = pdVar19, pdVar21 = pdVar20, !NAN(dVar53))) goto LAB_00151978;
  }
  pdVar18 = pdVar20;
  iVar13 = scale_expansion_zeroelim(elen,bct,dVar53,w);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar19,iVar13,w,pdVar18);
  pdVar21 = pdVar19;
LAB_00151978:
  if ((dVar23 != 0.0) || (pdVar19 = pdVar21, NAN(dVar23))) {
    iVar13 = scale_expansion_zeroelim(iVar15,cat,dVar23,w);
    iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar18,iVar13,w,pdVar21);
    pdVar19 = pdVar18;
    pdVar18 = pdVar21;
  }
  if ((dVar55 != 0.0) || (NAN(dVar55))) {
    iVar12 = scale_expansion_zeroelim(iVar12,abt,dVar55,w);
    iVar11 = fast_expansion_sum_zeroelim(iVar11,pdVar18,iVar12,w,pdVar19);
    pdVar18 = pdVar19;
  }
  return pdVar18[(long)iVar11 + -1];
}

Assistant:

REAL orient3dadapt(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL permanent)
{
  INEXACT REAL adx, bdx, cdx, ady, bdy, cdy, adz, bdz, cdz;
  REAL det, errbound;

  INEXACT REAL bdxcdy1, cdxbdy1, cdxady1, adxcdy1, adxbdy1, bdxady1;
  REAL bdxcdy0, cdxbdy0, cdxady0, adxcdy0, adxbdy0, bdxady0;
  REAL bc[4], ca[4], ab[4];
  INEXACT REAL bc3, ca3, ab3;
  REAL adet[8], bdet[8], cdet[8];
  int alen, blen, clen;
  REAL abdet[16];
  int ablen;
  REAL *finnow, *finother, *finswap;
  REAL fin1[192], fin2[192];
  int finlength;


  REAL adxtail, bdxtail, cdxtail;
  REAL adytail, bdytail, cdytail;
  REAL adztail, bdztail, cdztail;
  INEXACT REAL at_blarge, at_clarge;
  INEXACT REAL bt_clarge, bt_alarge;
  INEXACT REAL ct_alarge, ct_blarge;
  REAL at_b[4], at_c[4], bt_c[4], bt_a[4], ct_a[4], ct_b[4];
  int at_blen, at_clen, bt_clen, bt_alen, ct_alen, ct_blen;
  INEXACT REAL bdxt_cdy1, cdxt_bdy1, cdxt_ady1;
  INEXACT REAL adxt_cdy1, adxt_bdy1, bdxt_ady1;
  REAL bdxt_cdy0, cdxt_bdy0, cdxt_ady0;
  REAL adxt_cdy0, adxt_bdy0, bdxt_ady0;
  INEXACT REAL bdyt_cdx1, cdyt_bdx1, cdyt_adx1;
  INEXACT REAL adyt_cdx1, adyt_bdx1, bdyt_adx1;
  REAL bdyt_cdx0, cdyt_bdx0, cdyt_adx0;
  REAL adyt_cdx0, adyt_bdx0, bdyt_adx0;
  REAL bct[8], cat[8], abt[8];
  int bctlen, catlen, abtlen;
  INEXACT REAL bdxt_cdyt1, cdxt_bdyt1, cdxt_adyt1;
  INEXACT REAL adxt_cdyt1, adxt_bdyt1, bdxt_adyt1;
  REAL bdxt_cdyt0, cdxt_bdyt0, cdxt_adyt0;
  REAL adxt_cdyt0, adxt_bdyt0, bdxt_adyt0;
  REAL u[4], v[12], w[16];
  INEXACT REAL u3;
  int vlength, wlength;
  REAL negate;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k;
  REAL _0;


  adx = (REAL) (pa[0] - pd[0]);
  bdx = (REAL) (pb[0] - pd[0]);
  cdx = (REAL) (pc[0] - pd[0]);
  ady = (REAL) (pa[1] - pd[1]);
  bdy = (REAL) (pb[1] - pd[1]);
  cdy = (REAL) (pc[1] - pd[1]);
  adz = (REAL) (pa[2] - pd[2]);
  bdz = (REAL) (pb[2] - pd[2]);
  cdz = (REAL) (pc[2] - pd[2]);

  Two_Product(bdx, cdy, bdxcdy1, bdxcdy0);
  Two_Product(cdx, bdy, cdxbdy1, cdxbdy0);
  Two_Two_Diff(bdxcdy1, bdxcdy0, cdxbdy1, cdxbdy0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;
  alen = scale_expansion_zeroelim(4, bc, adz, adet);

  Two_Product(cdx, ady, cdxady1, cdxady0);
  Two_Product(adx, cdy, adxcdy1, adxcdy0);
  Two_Two_Diff(cdxady1, cdxady0, adxcdy1, adxcdy0, ca3, ca[2], ca[1], ca[0]);
  ca[3] = ca3;
  blen = scale_expansion_zeroelim(4, ca, bdz, bdet);

  Two_Product(adx, bdy, adxbdy1, adxbdy0);
  Two_Product(bdx, ady, bdxady1, bdxady0);
  Two_Two_Diff(adxbdy1, adxbdy0, bdxady1, bdxady0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;
  clen = scale_expansion_zeroelim(4, ab, cdz, cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, fin1);

  det = estimate(finlength, fin1);
  errbound = o3derrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pd[0], adx, adxtail);
  Two_Diff_Tail(pb[0], pd[0], bdx, bdxtail);
  Two_Diff_Tail(pc[0], pd[0], cdx, cdxtail);
  Two_Diff_Tail(pa[1], pd[1], ady, adytail);
  Two_Diff_Tail(pb[1], pd[1], bdy, bdytail);
  Two_Diff_Tail(pc[1], pd[1], cdy, cdytail);
  Two_Diff_Tail(pa[2], pd[2], adz, adztail);
  Two_Diff_Tail(pb[2], pd[2], bdz, bdztail);
  Two_Diff_Tail(pc[2], pd[2], cdz, cdztail);

  if ((adxtail == 0.0) && (bdxtail == 0.0) && (cdxtail == 0.0)
      && (adytail == 0.0) && (bdytail == 0.0) && (cdytail == 0.0)
      && (adztail == 0.0) && (bdztail == 0.0) && (cdztail == 0.0)) {
    return det;
  }

  errbound = o3derrboundC * permanent + resulterrbound * Absolute(det);
  det += (adz * ((bdx * cdytail + cdy * bdxtail)
                 - (bdy * cdxtail + cdx * bdytail))
          + adztail * (bdx * cdy - bdy * cdx))
       + (bdz * ((cdx * adytail + ady * cdxtail)
                 - (cdy * adxtail + adx * cdytail))
          + bdztail * (cdx * ady - cdy * adx))
       + (cdz * ((adx * bdytail + bdy * adxtail)
                 - (ady * bdxtail + bdx * adytail))
          + cdztail * (adx * bdy - ady * bdx));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  finnow = fin1;
  finother = fin2;

  if (adxtail == 0.0) {
    if (adytail == 0.0) {
      at_b[0] = 0.0;
      at_blen = 1;
      at_c[0] = 0.0;
      at_clen = 1;
    } else {
      negate = -adytail;
      Two_Product(negate, bdx, at_blarge, at_b[0]);
      at_b[1] = at_blarge;
      at_blen = 2;
      Two_Product(adytail, cdx, at_clarge, at_c[0]);
      at_c[1] = at_clarge;
      at_clen = 2;
    }
  } else {
    if (adytail == 0.0) {
      Two_Product(adxtail, bdy, at_blarge, at_b[0]);
      at_b[1] = at_blarge;
      at_blen = 2;
      negate = -adxtail;
      Two_Product(negate, cdy, at_clarge, at_c[0]);
      at_c[1] = at_clarge;
      at_clen = 2;
    } else {
      Two_Product(adxtail, bdy, adxt_bdy1, adxt_bdy0);
      Two_Product(adytail, bdx, adyt_bdx1, adyt_bdx0);
      Two_Two_Diff(adxt_bdy1, adxt_bdy0, adyt_bdx1, adyt_bdx0,
                   at_blarge, at_b[2], at_b[1], at_b[0]);
      at_b[3] = at_blarge;
      at_blen = 4;
      Two_Product(adytail, cdx, adyt_cdx1, adyt_cdx0);
      Two_Product(adxtail, cdy, adxt_cdy1, adxt_cdy0);
      Two_Two_Diff(adyt_cdx1, adyt_cdx0, adxt_cdy1, adxt_cdy0,
                   at_clarge, at_c[2], at_c[1], at_c[0]);
      at_c[3] = at_clarge;
      at_clen = 4;
    }
  }
  if (bdxtail == 0.0) {
    if (bdytail == 0.0) {
      bt_c[0] = 0.0;
      bt_clen = 1;
      bt_a[0] = 0.0;
      bt_alen = 1;
    } else {
      negate = -bdytail;
      Two_Product(negate, cdx, bt_clarge, bt_c[0]);
      bt_c[1] = bt_clarge;
      bt_clen = 2;
      Two_Product(bdytail, adx, bt_alarge, bt_a[0]);
      bt_a[1] = bt_alarge;
      bt_alen = 2;
    }
  } else {
    if (bdytail == 0.0) {
      Two_Product(bdxtail, cdy, bt_clarge, bt_c[0]);
      bt_c[1] = bt_clarge;
      bt_clen = 2;
      negate = -bdxtail;
      Two_Product(negate, ady, bt_alarge, bt_a[0]);
      bt_a[1] = bt_alarge;
      bt_alen = 2;
    } else {
      Two_Product(bdxtail, cdy, bdxt_cdy1, bdxt_cdy0);
      Two_Product(bdytail, cdx, bdyt_cdx1, bdyt_cdx0);
      Two_Two_Diff(bdxt_cdy1, bdxt_cdy0, bdyt_cdx1, bdyt_cdx0,
                   bt_clarge, bt_c[2], bt_c[1], bt_c[0]);
      bt_c[3] = bt_clarge;
      bt_clen = 4;
      Two_Product(bdytail, adx, bdyt_adx1, bdyt_adx0);
      Two_Product(bdxtail, ady, bdxt_ady1, bdxt_ady0);
      Two_Two_Diff(bdyt_adx1, bdyt_adx0, bdxt_ady1, bdxt_ady0,
                  bt_alarge, bt_a[2], bt_a[1], bt_a[0]);
      bt_a[3] = bt_alarge;
      bt_alen = 4;
    }
  }
  if (cdxtail == 0.0) {
    if (cdytail == 0.0) {
      ct_a[0] = 0.0;
      ct_alen = 1;
      ct_b[0] = 0.0;
      ct_blen = 1;
    } else {
      negate = -cdytail;
      Two_Product(negate, adx, ct_alarge, ct_a[0]);
      ct_a[1] = ct_alarge;
      ct_alen = 2;
      Two_Product(cdytail, bdx, ct_blarge, ct_b[0]);
      ct_b[1] = ct_blarge;
      ct_blen = 2;
    }
  } else {
    if (cdytail == 0.0) {
      Two_Product(cdxtail, ady, ct_alarge, ct_a[0]);
      ct_a[1] = ct_alarge;
      ct_alen = 2;
      negate = -cdxtail;
      Two_Product(negate, bdy, ct_blarge, ct_b[0]);
      ct_b[1] = ct_blarge;
      ct_blen = 2;
    } else {
      Two_Product(cdxtail, ady, cdxt_ady1, cdxt_ady0);
      Two_Product(cdytail, adx, cdyt_adx1, cdyt_adx0);
      Two_Two_Diff(cdxt_ady1, cdxt_ady0, cdyt_adx1, cdyt_adx0,
                   ct_alarge, ct_a[2], ct_a[1], ct_a[0]);
      ct_a[3] = ct_alarge;
      ct_alen = 4;
      Two_Product(cdytail, bdx, cdyt_bdx1, cdyt_bdx0);
      Two_Product(cdxtail, bdy, cdxt_bdy1, cdxt_bdy0);
      Two_Two_Diff(cdyt_bdx1, cdyt_bdx0, cdxt_bdy1, cdxt_bdy0,
                   ct_blarge, ct_b[2], ct_b[1], ct_b[0]);
      ct_b[3] = ct_blarge;
      ct_blen = 4;
    }
  }

  bctlen = fast_expansion_sum_zeroelim(bt_clen, bt_c, ct_blen, ct_b, bct);
  wlength = scale_expansion_zeroelim(bctlen, bct, adz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  catlen = fast_expansion_sum_zeroelim(ct_alen, ct_a, at_clen, at_c, cat);
  wlength = scale_expansion_zeroelim(catlen, cat, bdz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  abtlen = fast_expansion_sum_zeroelim(at_blen, at_b, bt_alen, bt_a, abt);
  wlength = scale_expansion_zeroelim(abtlen, abt, cdz, w);
  finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                          finother);
  finswap = finnow; finnow = finother; finother = finswap;

  if (adztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, bc, adztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (bdztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, ca, bdztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (cdztail != 0.0) {
    vlength = scale_expansion_zeroelim(4, ab, cdztail, v);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, vlength, v,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }

  if (adxtail != 0.0) {
    if (bdytail != 0.0) {
      Two_Product(adxtail, bdytail, adxt_bdyt1, adxt_bdyt0);
      Two_One_Product(adxt_bdyt1, adxt_bdyt0, cdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (cdztail != 0.0) {
        Two_One_Product(adxt_bdyt1, adxt_bdyt0, cdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (cdytail != 0.0) {
      negate = -adxtail;
      Two_Product(negate, cdytail, adxt_cdyt1, adxt_cdyt0);
      Two_One_Product(adxt_cdyt1, adxt_cdyt0, bdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (bdztail != 0.0) {
        Two_One_Product(adxt_cdyt1, adxt_cdyt0, bdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }
  if (bdxtail != 0.0) {
    if (cdytail != 0.0) {
      Two_Product(bdxtail, cdytail, bdxt_cdyt1, bdxt_cdyt0);
      Two_One_Product(bdxt_cdyt1, bdxt_cdyt0, adz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (adztail != 0.0) {
        Two_One_Product(bdxt_cdyt1, bdxt_cdyt0, adztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (adytail != 0.0) {
      negate = -bdxtail;
      Two_Product(negate, adytail, bdxt_adyt1, bdxt_adyt0);
      Two_One_Product(bdxt_adyt1, bdxt_adyt0, cdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (cdztail != 0.0) {
        Two_One_Product(bdxt_adyt1, bdxt_adyt0, cdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }
  if (cdxtail != 0.0) {
    if (adytail != 0.0) {
      Two_Product(cdxtail, adytail, cdxt_adyt1, cdxt_adyt0);
      Two_One_Product(cdxt_adyt1, cdxt_adyt0, bdz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (bdztail != 0.0) {
        Two_One_Product(cdxt_adyt1, cdxt_adyt0, bdztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
    if (bdytail != 0.0) {
      negate = -cdxtail;
      Two_Product(negate, bdytail, cdxt_bdyt1, cdxt_bdyt0);
      Two_One_Product(cdxt_bdyt1, cdxt_bdyt0, adz, u3, u[2], u[1], u[0]);
      u[3] = u3;
      finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                              finother);
      finswap = finnow; finnow = finother; finother = finswap;
      if (adztail != 0.0) {
        Two_One_Product(cdxt_bdyt1, cdxt_bdyt0, adztail, u3, u[2], u[1], u[0]);
        u[3] = u3;
        finlength = fast_expansion_sum_zeroelim(finlength, finnow, 4, u,
                                                finother);
        finswap = finnow; finnow = finother; finother = finswap;
      }
    }
  }

  if (adztail != 0.0) {
    wlength = scale_expansion_zeroelim(bctlen, bct, adztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (bdztail != 0.0) {
    wlength = scale_expansion_zeroelim(catlen, cat, bdztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }
  if (cdztail != 0.0) {
    wlength = scale_expansion_zeroelim(abtlen, abt, cdztail, w);
    finlength = fast_expansion_sum_zeroelim(finlength, finnow, wlength, w,
                                            finother);
    finswap = finnow; finnow = finother; finother = finswap;
  }

  return finnow[finlength - 1];
}